

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

void Sfm_DecPrint(Sfm_Dec_t *p,word (*Masks) [8])

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  ulong local_58;
  
  local_58 = 0;
  do {
    uVar1 = p->iTarget;
    lVar9 = (long)(int)uVar1;
    if ((lVar9 < 0) || ((p->vObjFanins).nSize <= (int)uVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    pcVar7 = "OFF";
    if (local_58 == 0) {
      pcVar7 = "ON";
    }
    if ((p->vObjGates).nSize <= (int)uVar1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar5 = (p->vObjGates).pArray[lVar9];
    if (((long)iVar5 < 0) || ((p->vGateHands).nSize <= iVar5)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pVVar2 = (p->vObjFanins).pArray;
    uVar3 = p->nDivs;
    pcVar4 = Mio_GateReadName((Mio_Gate_t *)(p->vGateHands).pArray[iVar5]);
    printf("%s-SET of object %d (divs = %d) with gate \"%s\" and fanins: ",pcVar7,(ulong)uVar1,
           (ulong)uVar3,pcVar4);
    if (0 < pVVar2[lVar9].nSize) {
      lVar6 = 0;
      do {
        printf("%d ");
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar2[lVar9].nSize);
    }
    putchar(10);
    printf("Implications: ");
    if (0 < p->vImpls[local_58].nSize) {
      lVar9 = 0;
      do {
        uVar1 = p->vImpls[local_58].pArray[lVar9];
        if ((int)uVar1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        pcVar7 = "!";
        if ((uVar1 & 1) == 0) {
          pcVar7 = "";
        }
        uVar3 = Sfm_DecFindCost(p,(int)local_58,uVar1,Masks[local_58 & 0xffffffff ^ 1]);
        printf("%s%d(%d) ",pcVar7,(ulong)(uVar1 >> 1),(ulong)uVar3);
        lVar9 = lVar9 + 1;
      } while (lVar9 < p->vImpls[local_58].nSize);
    }
    putchar(10);
    printf("     ");
    if (0 < p->nDivs) {
      iVar5 = 0;
      do {
        printf("%d");
        iVar5 = iVar5 + 1;
      } while (iVar5 < p->nDivs);
    }
    putchar(10);
    printf("     ");
    if (0 < p->nDivs) {
      iVar5 = 0;
      do {
        printf("%d");
        iVar5 = iVar5 + 1;
      } while (iVar5 < p->nDivs);
    }
    putchar(10);
    if (0 < p->nPats[local_58]) {
      uVar8 = 0;
      do {
        printf("%2d : ");
        if (0 < p->nDivs) {
          lVar9 = 0;
          lVar6 = 0;
          do {
            if (p->vSets[local_58].nSize <= lVar9) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                            ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
            }
            printf("%d",(ulong)((*(ulong *)((long)p->vSets[local_58].pArray +
                                           lVar9 * 8 + (uVar8 >> 3 & 0xfffffffffffffff8)) >>
                                 ((uint)uVar8 & 0x3f) & 1) != 0));
            lVar6 = lVar6 + 1;
            lVar9 = lVar9 + 8;
          } while (lVar6 < p->nDivs);
        }
        putchar(10);
        uVar8 = uVar8 + 1;
      } while ((int)uVar8 < p->nPats[local_58]);
    }
    bVar10 = local_58 == 0;
    local_58 = local_58 + 1;
  } while (bVar10);
  return;
}

Assistant:

void Sfm_DecPrint( Sfm_Dec_t * p, word Masks[2][SFM_SIM_WORDS] )
{
    int c, i, k, Entry;
    for ( c = 0; c < 2; c++ )
    {
        Vec_Int_t * vLevel = Vec_WecEntry( &p->vObjFanins, p->iTarget );
        printf( "%s-SET of object %d (divs = %d) with gate \"%s\" and fanins: ", 
            c ? "OFF": "ON", p->iTarget, p->nDivs, 
            Mio_GateReadName((Mio_Gate_t *)Vec_PtrEntry(&p->vGateHands, Vec_IntEntry(&p->vObjGates,p->iTarget))) );
        Vec_IntForEachEntry( vLevel, Entry, i )
            printf( "%d ", Entry );
        printf( "\n" );

        printf( "Implications: " );
        Vec_IntForEachEntry( &p->vImpls[c], Entry, i )
            printf( "%s%d(%d) ", Abc_LitIsCompl(Entry)? "!":"", Abc_Lit2Var(Entry), Sfm_DecFindCost(p, c, Entry, Masks[!c]) );
        printf( "\n" );
        printf( "     " );
        for ( i = 0; i < p->nDivs; i++ )
            printf( "%d", (i / 10) % 10 );
        printf( "\n" );
        printf( "     " );
        for ( i = 0; i < p->nDivs; i++ )
            printf( "%d", i % 10 );
        printf( "\n" );
        for ( k = 0; k < p->nPats[c]; k++ )
        {
            printf( "%2d : ", k );
            for ( i = 0; i < p->nDivs; i++ )
                printf( "%d", Abc_TtGetBit(Sfm_DecDivPats(p, i, c), k) );
            printf( "\n" );
        }
        //printf( "\n" );
    }
}